

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringPool.hpp
# Opt level: O1

Char * __thiscall Diligent::StringPool::CopyString(StringPool *this,char *Str)

{
  char *pcVar1;
  Char *pCVar2;
  char cVar3;
  Char *pCVar4;
  char *pcVar5;
  string msg;
  string local_30;
  
  if (Str == (char *)0x0) {
    pCVar4 = (Char *)0x0;
  }
  else {
    pCVar4 = this->m_pCurrPtr;
    cVar3 = *Str;
    if (cVar3 != '\0') {
      pcVar5 = Str + 1;
      do {
        pcVar1 = this->m_pCurrPtr;
        if (this->m_pBuffer + this->m_ReservedSize <= pcVar1) break;
        this->m_pCurrPtr = pcVar1 + 1;
        *pcVar1 = cVar3;
        cVar3 = *pcVar5;
        pcVar5 = pcVar5 + 1;
      } while (cVar3 != '\0');
    }
    pCVar2 = this->m_pCurrPtr;
    if (pCVar2 < this->m_pBuffer + this->m_ReservedSize) {
      this->m_pCurrPtr = pCVar2 + 1;
      *pCVar2 = '\0';
    }
    else {
      FormatString<char[45]>
                (&local_30,(char (*) [45])"Not enough space reserved in the string pool");
      DebugAssertionFailed
                (local_30._M_dataplus._M_p,"CopyString",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/StringPool.hpp"
                 ,0x95);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return pCVar4;
}

Assistant:

Char* CopyString(const char* Str)
    {
        if (Str == nullptr)
            return nullptr;

        auto* Ptr = m_pCurrPtr;
        while (*Str != 0 && m_pCurrPtr < m_pBuffer + m_ReservedSize)
        {
            *(m_pCurrPtr++) = *(Str++);
        }
        if (m_pCurrPtr < m_pBuffer + m_ReservedSize)
            *(m_pCurrPtr++) = 0;
        else
            UNEXPECTED("Not enough space reserved in the string pool");
        return Ptr;
    }